

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::SetWhat<char_const*,char_const(&)[7],char_const*>
          (Exception *this,ostringstream *oss,char **arg,char (*args) [7],char **args_1)

{
  Exception *in_RCX;
  undefined8 *in_RDX;
  ostream *in_RSI;
  char (*in_RDI) [7];
  ostringstream *in_R8;
  char **in_stack_ffffffffffffffc8;
  
  std::operator<<(in_RSI,(char *)*in_RDX);
  SetWhat<char_const(&)[7],char_const*>(in_RCX,in_R8,in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }